

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

int Lf_ManComputeCrossCut(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  uint local_24;
  uint local_20;
  int nCutCur;
  int nCutMax;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  local_20 = 0;
  local_24 = 0;
  if (p->pMuxes != (uint *)0x0) {
    __assert_fail("p->pMuxes == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                  ,0xe5,"int Lf_ManComputeCrossCut(Gia_Man_t *)");
  }
  nCutCur = 0;
  while( true ) {
    bVar4 = false;
    if (nCutCur < p->nObjs) {
      _nCutMax = Gia_ManObj(p,nCutCur);
      bVar4 = _nCutMax != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    _nCutMax->Value = 0;
    nCutCur = nCutCur + 1;
  }
  nCutCur = 0;
  while( true ) {
    bVar4 = false;
    if (nCutCur < p->nObjs) {
      _nCutMax = Gia_ManObj(p,nCutCur);
      bVar4 = _nCutMax != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjIsAnd(_nCutMax);
    if (iVar1 != 0) {
      pGVar3 = Gia_ObjFanin0(_nCutMax);
      iVar1 = Gia_ObjIsAnd(pGVar3);
      if (iVar1 != 0) {
        pGVar3 = Gia_ObjFanin0(_nCutMax);
        pGVar3->Value = pGVar3->Value + 1;
      }
      pGVar3 = Gia_ObjFanin1(_nCutMax);
      iVar1 = Gia_ObjIsAnd(pGVar3);
      if (iVar1 != 0) {
        pGVar3 = Gia_ObjFanin1(_nCutMax);
        pGVar3->Value = pGVar3->Value + 1;
      }
    }
    nCutCur = nCutCur + 1;
  }
  nCutCur = 0;
  while( true ) {
    bVar4 = false;
    if (nCutCur < p->nObjs) {
      _nCutMax = Gia_ManObj(p,nCutCur);
      bVar4 = _nCutMax != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjIsAnd(_nCutMax);
    if (iVar1 != 0) {
      if (_nCutMax->Value != 0) {
        local_24 = local_24 + 1;
      }
      if ((int)local_20 < (int)local_24) {
        local_20 = local_24;
      }
      pGVar3 = Gia_ObjFanin0(_nCutMax);
      iVar1 = Gia_ObjIsAnd(pGVar3);
      if (iVar1 != 0) {
        pGVar3 = Gia_ObjFanin0(_nCutMax);
        uVar2 = pGVar3->Value - 1;
        pGVar3->Value = uVar2;
        if (uVar2 == 0) {
          local_24 = local_24 - 1;
        }
      }
      pGVar3 = Gia_ObjFanin1(_nCutMax);
      iVar1 = Gia_ObjIsAnd(pGVar3);
      if (iVar1 != 0) {
        pGVar3 = Gia_ObjFanin1(_nCutMax);
        uVar2 = pGVar3->Value - 1;
        pGVar3->Value = uVar2;
        if (uVar2 == 0) {
          local_24 = local_24 - 1;
        }
      }
    }
    nCutCur = nCutCur + 1;
  }
  if (local_24 == 0) {
    nCutCur = 0;
    while( true ) {
      bVar4 = false;
      if (nCutCur < p->nObjs) {
        _nCutMax = Gia_ManObj(p,nCutCur);
        bVar4 = _nCutMax != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      if (_nCutMax->Value != 0) {
        __assert_fail("pObj->Value == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                      ,0xfe,"int Lf_ManComputeCrossCut(Gia_Man_t *)");
      }
      nCutCur = nCutCur + 1;
    }
    printf("CutMax = %d\n",(ulong)local_20);
    return local_20;
  }
  __assert_fail("nCutCur == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                ,0xfa,"int Lf_ManComputeCrossCut(Gia_Man_t *)");
}

Assistant:

int Lf_ManComputeCrossCut( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, nCutMax = 0, nCutCur = 0;
    assert( p->pMuxes == NULL );
    Gia_ManForEachObj( p, pObj, i )
        pObj->Value = 0;
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) )
            Gia_ObjFanin0(pObj)->Value++;
        if ( Gia_ObjIsAnd(Gia_ObjFanin1(pObj)) )
            Gia_ObjFanin1(pObj)->Value++;
    }
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( pObj->Value )
            nCutCur++;
        if ( nCutMax < nCutCur )
            nCutMax = nCutCur;
        if ( Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) && --Gia_ObjFanin0(pObj)->Value == 0 )
            nCutCur--;
        if ( Gia_ObjIsAnd(Gia_ObjFanin1(pObj)) && --Gia_ObjFanin1(pObj)->Value == 0 )
            nCutCur--;
    }
    assert( nCutCur == 0 );
    if ( nCutCur )
        printf( "Cutset is not 0\n" );
    Gia_ManForEachObj( p, pObj, i )
        assert( pObj->Value == 0 );
    printf( "CutMax = %d\n", nCutMax );
    return nCutMax;
}